

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O2

void warning_report(string *message)

{
  ostream *poVar1;
  
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  poVar1 = std::operator<<(poVar1,"WARNING!\t");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::endl<char,std::char_traits<char>>(poVar1);
  warning_count = warning_count + 1;
  return;
}

Assistant:

void warning_report(std::string message)
{
	std::cerr << std::endl << "WARNING!\t" << message << std::endl;
	warning_count++;
}